

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O0

void __thiscall cmake::StopDebuggerIfNeeded(cmake *this,int exitCode)

{
  bool bVar1;
  element_type *this_00;
  int exitCode_local;
  cmake *this_local;
  
  bVar1 = GetDebuggerOn(this);
  if ((bVar1) && (bVar1 = std::operator!=(&this->DebugAdapter,(nullptr_t)0x0), bVar1)) {
    this_00 = std::
              __shared_ptr_access<cmDebugger::cmDebuggerAdapter,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<cmDebugger::cmDebuggerAdapter,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&this->DebugAdapter);
    cmDebugger::cmDebuggerAdapter::ReportExitCode(this_00,exitCode);
    std::__shared_ptr<cmDebugger::cmDebuggerAdapter,_(__gnu_cxx::_Lock_policy)2>::reset
              (&(this->DebugAdapter).
                super___shared_ptr<cmDebugger::cmDebuggerAdapter,_(__gnu_cxx::_Lock_policy)2>);
  }
  return;
}

Assistant:

void cmake::StopDebuggerIfNeeded(int exitCode)
{
  if (!this->GetDebuggerOn()) {
    return;
  }

  // The debug adapter may have failed to start (e.g. invalid pipe path).
  if (DebugAdapter != nullptr) {
    DebugAdapter->ReportExitCode(exitCode);
    DebugAdapter.reset();
  }
}